

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose
          (Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> *this)

{
  Iface *object;
  Iface *ptrCopy;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> *this_local;
  
  object = this->ptr;
  if (object != (Iface *)0x0) {
    this->ptr = (Iface *)0x0;
    Disposer::dispose<kj::Function<kj::MainBuilder::Validity()>::Iface>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }